

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O2

void __thiscall
cppcms::session_pool::storage
          (session_pool *this,
          unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
          *s)

{
  std::
  __uniq_ptr_impl<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  ::operator=((__uniq_ptr_impl<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
               *)&this->storage_,
              (__uniq_ptr_impl<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
               *)s);
  return;
}

Assistant:

void session_pool::storage(std::unique_ptr<sessions::session_storage_factory> s)
{
	storage_=std::move(s);
}